

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O3

QTextObject * __thiscall
QTextDocumentPrivate::objectForIndex(QTextDocumentPrivate *this,int objectIndex)

{
  QTextObject *pQVar1;
  QTextDocumentPrivate *that;
  long in_FS_OFFSET;
  int local_3c;
  Data *local_38;
  QTextFormat *pQStack_30;
  Data *local_20;
  
  local_20 = *(Data **)(in_FS_OFFSET + 0x28);
  local_3c = objectIndex;
  if (objectIndex < 0) {
    pQVar1 = (QTextObject *)0x0;
  }
  else {
    local_38 = (Data *)0x0;
    pQVar1 = QMap<int,_QTextObject_*>::value
                       (&this->objects,&local_3c,(QTextObject **)&stack0xffffffffffffffc8);
    if (pQVar1 == (QTextObject *)0x0) {
      local_38 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      pQStack_30 = (QTextFormat *)&DAT_aaaaaaaaaaaaaaaa;
      QTextFormatCollection::objectFormatIndex(&this->formats,local_3c);
      QTextFormatCollection::format
                ((QTextFormatCollection *)&stack0xffffffffffffffc8,(int)&this->formats);
      pQVar1 = createObject(this,(QTextFormat *)&stack0xffffffffffffffc8,local_3c);
      QTextFormat::~QTextFormat((QTextFormat *)&stack0xffffffffffffffc8);
    }
  }
  if (*(Data **)(in_FS_OFFSET + 0x28) == local_20) {
    return pQVar1;
  }
  __stack_chk_fail();
}

Assistant:

QTextObject *QTextDocumentPrivate::objectForIndex(int objectIndex) const
{
    if (objectIndex < 0)
        return nullptr;

    QTextObject *object = objects.value(objectIndex, nullptr);
    if (!object) {
        QTextDocumentPrivate *that = const_cast<QTextDocumentPrivate *>(this);
        QTextFormat fmt = formats.objectFormat(objectIndex);
        object = that->createObject(fmt, objectIndex);
    }
    return object;
}